

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

string * __thiscall MemoryManager::dumpMemory_abi_cxx11_(MemoryManager *this)

{
  long in_RSI;
  string *in_RDI;
  uint32_t k;
  uint32_t j;
  uint32_t i;
  char buf [65536];
  string *dump;
  uint uStack_10038;
  uint uStack_10034;
  uint uStack_10030;
  char acStack_10018 [65560];
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::operator+=(in_RDI,"Memory Pages: \n");
  for (uStack_10030 = 0; uStack_10030 < 0x400; uStack_10030 = uStack_10030 + 1) {
    if (*(long *)(in_RSI + (ulong)uStack_10030 * 8) != 0) {
      sprintf(acStack_10018,"0x%x-0x%x:\n",(ulong)(uStack_10030 * 0x400000),
              (ulong)(uStack_10030 * 0x400000 + 0x400000));
      std::__cxx11::string::operator+=(in_RDI,acStack_10018);
      for (uStack_10034 = 0; uStack_10034 < 0x400; uStack_10034 = uStack_10034 + 1) {
        if (*(long *)(*(long *)(in_RSI + (ulong)uStack_10030 * 8) + (ulong)uStack_10034 * 8) != 0) {
          sprintf(acStack_10018,"  0x%x-0x%x\n",
                  (ulong)(uStack_10030 * 0x400000 + uStack_10034 * 0x1000),
                  (ulong)(uStack_10030 * 0x400000 + 0x1000 + uStack_10034 * 0x1000));
          std::__cxx11::string::operator+=(in_RDI,acStack_10018);
          for (uStack_10038 = 0; uStack_10038 < 0x400; uStack_10038 = uStack_10038 + 1) {
            sprintf(acStack_10018,"    0x%x: 0x%x\n",
                    (ulong)(uStack_10030 * 0x400000 + uStack_10034 * 0x1000 + uStack_10038),
                    (ulong)*(byte *)(*(long *)(*(long *)(in_RSI + (ulong)uStack_10030 * 8) +
                                              (ulong)uStack_10034 * 8) + (ulong)uStack_10038));
            std::__cxx11::string::operator+=(in_RDI,acStack_10018);
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string MemoryManager::dumpMemory() {
  char buf[65536];
  std::string dump;

  dump += "Memory Pages: \n";
  for (uint32_t i = 0; i < 1024; ++i) {
    if (this->memory[i] == nullptr) {
      continue;
    }
    sprintf(buf, "0x%x-0x%x:\n", i << 22, (i + 1) << 22);
    dump += buf;
    for (uint32_t j = 0; j < 1024; ++j) {
      if (this->memory[i][j] == nullptr) {
        continue;
      }
      sprintf(buf, "  0x%x-0x%x\n", (i << 22) + (j << 12),
              (i << 22) + ((j + 1) << 12));
      dump += buf;

      for (uint32_t k = 0; k < 1024; ++k) {
        sprintf(buf, "    0x%x: 0x%x\n", (i << 22) + (j << 12) + k,
                this->memory[i][j][k]);
        dump += buf;
      }
    }
  }
  return dump;
}